

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedSnapshotRecord.cpp
# Opt level: O1

Entry * __thiscall
cali::CompressedSnapshotRecordView::unpack_next_entry
          (Entry *__return_storage_ptr__,CompressedSnapshotRecordView *this,
          CaliperMetadataAccessInterface *c,size_t *n,size_t *pos)

{
  byte bVar1;
  size_t sVar2;
  uchar *puVar3;
  anon_union_8_7_33918203_for_value aVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  byte bVar7;
  long lVar8;
  ulong uVar9;
  cali_variant_t cVar10;
  Node *pNVar6;
  
  if (*n == 0) {
    *pos = 1;
  }
  uVar9 = *n;
  if (uVar9 < this->m_num_nodes) {
    *n = uVar9 + 1;
    sVar2 = *pos;
    bVar7 = 0;
    lVar8 = 0;
    uVar9 = 0;
    do {
      bVar1 = this->m_buffer[lVar8 + sVar2];
      if (-1 < (char)bVar1) goto LAB_00188166;
      uVar9 = uVar9 | (ulong)(bVar1 & 0x7f) << (bVar7 & 0x3f);
      lVar8 = lVar8 + 1;
      bVar7 = bVar7 + 7;
    } while (lVar8 != 9);
    lVar8 = 9;
LAB_00188166:
    bVar7 = this->m_buffer[lVar8 + sVar2];
    *pos = sVar2 + lVar8 + 1;
    iVar5 = (**c->_vptr_CaliperMetadataAccessInterface)
                      (c,(ulong)(bVar7 & 0x7f) << ((char)lVar8 * '\a' & 0x3fU) | uVar9);
    pNVar6 = (Node *)CONCAT44(extraout_var,iVar5);
    __return_storage_ptr__->m_node = pNVar6;
    aVar4 = (pNVar6->m_data).m_v.value;
    (__return_storage_ptr__->m_value).m_v.type_and_size = (pNVar6->m_data).m_v.type_and_size;
    (__return_storage_ptr__->m_value).m_v.value = aVar4;
  }
  else {
    if (uVar9 == this->m_num_nodes) {
      *pos = this->m_imm_pos + 1;
    }
    if (*n < this->m_num_imm + this->m_num_nodes) {
      *n = *n + 1;
      puVar3 = this->m_buffer;
      sVar2 = *pos;
      bVar7 = 0;
      lVar8 = 0;
      uVar9 = 0;
      do {
        if (-1 < (char)puVar3[lVar8 + sVar2]) goto LAB_001881f9;
        uVar9 = uVar9 | (ulong)(puVar3[lVar8 + sVar2] & 0x7f) << (bVar7 & 0x3f);
        lVar8 = lVar8 + 1;
        bVar7 = bVar7 + 7;
      } while (lVar8 != 9);
      lVar8 = 9;
LAB_001881f9:
      bVar7 = puVar3[lVar8 + sVar2];
      *pos = sVar2 + lVar8 + 1;
      cVar10 = cali_variant_unpack(puVar3 + sVar2 + lVar8 + 1,pos,(_Bool *)0x0);
      iVar5 = (*c->_vptr_CaliperMetadataAccessInterface[1])
                        (c,(ulong)(bVar7 & 0x7f) << ((char)lVar8 * '\a' & 0x3fU) | uVar9);
      __return_storage_ptr__->m_node = (Node *)CONCAT44(extraout_var_00,iVar5);
      (__return_storage_ptr__->m_value).m_v = cVar10;
    }
    else {
      __return_storage_ptr__->m_node = (Node *)0x0;
      (__return_storage_ptr__->m_value).m_v.type_and_size = 0;
      (__return_storage_ptr__->m_value).m_v.value.v_uint = 0;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Entry CompressedSnapshotRecordView::unpack_next_entry(const CaliperMetadataAccessInterface* c, size_t& n, size_t& pos)
{
    if (n == 0)
        pos = 1;

    if (n < m_num_nodes) {
        ++n;
        return Entry(c->node(vldec_u64(m_buffer + pos, &pos)));
    }

    if (n == m_num_nodes)
        pos = m_imm_pos + 1;

    if (n < m_num_nodes + m_num_imm) {
        ++n;

        cali_id_t id   = vldec_u64(m_buffer + pos, &pos);
        Variant   data = Variant::unpack(m_buffer + pos, &pos, nullptr);

        return Entry(c->get_attribute(id), data);
    }

    return Entry();
}